

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::CloseGap(ON_PolyCurve *this,int gap_index,int ends_to_modify)

{
  ON_Curve **ppOVar1;
  ON_Object *p;
  ON_Object *p_00;
  ON_Curve *pOVar2;
  double dVar3;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint Q;
  ON_3dPoint Q_00;
  bool bVar4;
  bool bVar5;
  ON_ArcCurve *pOVar6;
  ON_NurbsCurve *pOVar7;
  char *sFormat;
  ON_3dPoint *Q_01;
  ON_Line *line;
  int line_number;
  ulong uVar8;
  long lVar9;
  ON_3dPoint *P_01;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dPoint P0;
  ON_3dPoint P1;
  ON_Line line0;
  ON_Line line1;
  ON_3dPoint local_138;
  ON_3dPoint local_118;
  ulong local_f8;
  ON_3dPoint local_f0;
  ON_3dPoint local_d8;
  ON_ArcCurve *local_c0;
  ON_Object *local_b8;
  ON_Object *local_b0;
  long local_a8;
  double local_a0;
  ON_ArcCurve *local_98;
  ON_Line local_90;
  ON_Line local_60;
  
  if ((gap_index < 1) || ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= gap_index))
  {
    sFormat = "Invalid gap_index parameter.";
    line_number = 0x4b0;
LAB_00590201:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  local_a8 = (long)gap_index;
  ppOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  p = (ON_Object *)ppOVar1[local_a8 + -1];
  p_00 = (ON_Object *)ppOVar1[(uint)gap_index];
  if (p_00 == (ON_Object *)0x0 || p == (ON_Object *)0x0) {
    sFormat = "Null curve segments.";
    line_number = 0x4b8;
    goto LAB_00590201;
  }
  ON_Curve::PointAtEnd(&local_f0,(ON_Curve *)p);
  ON_Curve::PointAtStart(&local_d8,(ON_Curve *)p_00);
  bVar4 = ON_3dPoint::operator==(&local_f0,&local_d8);
  if (bVar4) {
    return false;
  }
  local_118.z = local_f0.z;
  local_118.x = local_f0.x;
  local_118.y = local_f0.y;
  local_138.z = local_d8.z;
  local_138.x = local_d8.x;
  local_138.y = local_d8.y;
  local_f8 = (ulong)(uint)gap_index;
  local_b0 = p;
  pOVar6 = ON_ArcCurve::Cast(p);
  local_b8 = p_00;
  local_98 = ON_ArcCurve::Cast(p_00);
  lVar9 = local_a8;
  local_c0 = pOVar6;
  if (local_98 == (ON_ArcCurve *)0x0 || pOVar6 == (ON_ArcCurve *)0x0) {
    if (local_98 == (ON_ArcCurve *)0x0 && pOVar6 != (ON_ArcCurve *)0x0) goto LAB_0059031e;
    if (pOVar6 != (ON_ArcCurve *)0x0 || local_98 == (ON_ArcCurve *)0x0) {
      ON_Line::ON_Line(&local_90);
      ON_Line::ON_Line(&local_60);
      uVar8 = local_f8;
      if (local_c0 == (ON_ArcCurve *)0x0) {
        bVar4 = ON_Curve::LastSpanIsLinear((ON_Curve *)local_b0,0.0,0.0,&local_90);
      }
      else {
        bVar4 = false;
      }
      if (local_c0 == (ON_ArcCurve *)0x0) {
        bVar5 = ON_Curve::FirstSpanIsLinear((ON_Curve *)local_b8,0.0,0.0,&local_60);
      }
      else {
        bVar5 = false;
      }
      if ((bVar4 & bVar5) == 1) {
        LineLineTieBreaker(&local_90,&local_60,&local_118,&local_138);
      }
      else if ((bVar5 | bVar4) == 1) {
        bVar4 = bVar4 != false;
        Q_01 = &local_118;
        if (bVar4) {
          Q_01 = &local_138;
        }
        P_01 = &local_d8;
        if (bVar4) {
          P_01 = &local_f0;
        }
        line = &local_60;
        if (bVar4) {
          line = &local_90;
        }
        SetLineIsoCoords(line,P_01,Q_01);
      }
      ON_Line::~ON_Line(&local_60);
      ON_Line::~ON_Line(&local_90);
      goto LAB_0059036e;
    }
  }
  else {
    local_a0 = ON_Arc::Length(&local_98->m_arc);
    dVar3 = ON_Arc::Length(&pOVar6->m_arc);
    if (local_a0 < dVar3) {
LAB_0059031e:
      local_138.z = local_f0.z;
      local_138.x = local_f0.x;
      local_138.y = local_f0.y;
      uVar8 = local_f8;
      lVar9 = local_a8;
      goto LAB_0059036e;
    }
  }
  local_118.z = local_d8.z;
  local_118.x = local_d8.x;
  local_118.y = local_d8.y;
  uVar8 = local_f8;
  lVar9 = local_a8;
LAB_0059036e:
  if ((local_118.x != local_138.x) || (NAN(local_118.x) || NAN(local_138.x))) {
    local_138.x = (local_f0.x + local_d8.x) * 0.5;
    local_118.x = local_138.x;
  }
  if ((local_118.y != local_138.y) || (NAN(local_118.y) || NAN(local_138.y))) {
    local_138.y = (local_f0.y + local_d8.y) * 0.5;
    local_118.y = local_138.y;
  }
  if ((local_118.z != local_138.z) || (NAN(local_118.z) || NAN(local_138.z))) {
    local_138.z = (local_f0.z + local_d8.z) * 0.5;
    local_118.z = local_138.z;
  }
  lVar9 = lVar9 + -1;
  bVar4 = ON_3dPoint::operator!=(&local_118,&local_f0);
  if (bVar4) {
    if (local_c0 == (ON_ArcCurve *)0x0) {
      (*local_b0->_vptr_ON_Object[0x3a])();
    }
    else {
      P.y._0_4_ = SUB84(local_f0.y,0);
      P.x = local_f0.x;
      P.y._4_4_ = (int)((ulong)local_f0.y >> 0x20);
      P.z = local_f0.z;
      Q.y = local_118.y;
      Q.x = local_118.x;
      Q.z = local_118.z;
      pOVar7 = ChangeArcEnd(local_c0,P,Q,1);
      if (pOVar7 != (ON_NurbsCurve *)0x0) {
        pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar9];
        if (pOVar2 != (ON_Curve *)0x0) {
          (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar9] = &pOVar7->super_ON_Curve;
      }
    }
  }
  bVar4 = ON_3dPoint::operator!=(&local_138,&local_d8);
  if (bVar4) {
    if (local_98 == (ON_ArcCurve *)0x0) {
      (*local_b8->_vptr_ON_Object[0x39])();
    }
    else {
      P_00.y._0_4_ = SUB84(local_d8.y,0);
      P_00.x = local_d8.x;
      P_00.y._4_4_ = (int)((ulong)local_d8.y >> 0x20);
      P_00.z = local_d8.z;
      Q_00.y = local_138.y;
      Q_00.x = local_138.x;
      Q_00.z = local_138.z;
      pOVar7 = ChangeArcEnd(local_98,P_00,Q_00,0);
      if (pOVar7 != (ON_NurbsCurve *)0x0) {
        pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8];
        if (pOVar2 != (ON_Curve *)0x0) {
          (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8] = &pOVar7->super_ON_Curve;
      }
    }
  }
  bVar4 = HasGapAt(this,(int)lVar9);
  return !bVar4;
}

Assistant:

bool ON_PolyCurve::CloseGap( int gap_index, int ends_to_modify )
{
  const int count = m_segment.Count();

  if ( gap_index <= 0 || gap_index >= count )
  {
    ON_ERROR("Invalid gap_index parameter.");
    return 0; // nothing to do
  }

  ON_Curve* c0 = m_segment[gap_index-1];
  ON_Curve* c1 = m_segment[gap_index];
  if ( 0 == c0 || 0 == c1 )
  {
    ON_ERROR("Null curve segments.");
    return false; // invalid polycurve
  }

  const ON_3dPoint P0 = c0->PointAtEnd();
  const ON_3dPoint P1 = c1->PointAtStart();
  if ( P0 == P1 )
    return false; // nothing to do

  ON_3dPoint Q0(P0);
  ON_3dPoint Q1(P1);

  const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
  const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);

  if ( 0 != arc0 && 0 != arc1 )
  {
    if ( arc1->m_arc.Length() < arc0->m_arc.Length() )
      Q1 = P0;
    else
      Q0 = P1;
  }
  else if ( 0 != arc0 && 0 == arc1 )
  {
    Q1 = P0;
  }
  else if ( 0 != arc1 && 0 == arc0 )
  {
    Q0 = P1;
  }
  else
  {
    ON_Line line0, line1;
    double min_line_length = 0.0;
    double is_linear_tolerance = 0.0;
    bool bLine0 = (0 == arc0)
                ? c0->LastSpanIsLinear(min_line_length,is_linear_tolerance,&line0)
                : false;
    bool bLine1 = (0 == arc0)
                ? c1->FirstSpanIsLinear(min_line_length,is_linear_tolerance,&line1)
                : false;
    if ( bLine0 && bLine1 )
      LineLineTieBreaker(line0,line1,Q0,Q1);
    else if ( bLine0 )
      SetLineIsoCoords(line0,P0,Q1);
    else if ( bLine1 )
      SetLineIsoCoords(line1,P1,Q0);
  }

  if ( Q0.x != Q1.x )
    Q0.x = Q1.x = 0.5*(P0.x + P1.x);
  if ( Q0.y != Q1.y )
    Q0.y = Q1.y = 0.5*(P0.y + P1.y);
  if ( Q0.z != Q1.z )
    Q0.z = Q1.z = 0.5*(P0.z + P1.z);

  if ( Q0 != P0 )
  {
    if ( 0 != arc0 )
    {
      ON_NurbsCurve* nc0 = ChangeArcEnd( arc0, P0, Q0 , 1 );
      if ( nc0 )
      {
        delete m_segment[gap_index-1];
        m_segment[gap_index-1] = nc0;
        c0 = nc0;
        arc0 = 0;
      }
    }
    else
    {
      c0->SetEndPoint(Q0);
    }
  }

  if ( Q1 != P1 )
  {
    if ( 0 != arc1 )
    {
      ON_NurbsCurve* nc1 = ChangeArcEnd( arc1, P1, Q1, 0 );
      if ( nc1 )
      {
        delete m_segment[gap_index];
        m_segment[gap_index] = nc1;
        c0 = nc1;
        arc1 = 0;
      }
    }
    else
    {
      c1->SetStartPoint(Q1);
    }
  }

  return HasGapAt(gap_index-1) ? false : true;
}